

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O0

error_code __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::init_asio
          (connection<websocketpp::config::asio::transport_config> *this,io_service_ptr io_service)

{
  reference_wrapper<asio::io_context> rVar1;
  connection *in_RSI;
  long in_RDI;
  shared_ptr<asio::io_context::strand> *this_00;
  error_code eVar2;
  error_code ec;
  io_context *in_stack_ffffffffffffff78;
  shared_ptr<asio::io_context::strand> *__r;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 uVar3;
  element_type *in_stack_ffffffffffffffd0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd8;
  
  *(connection **)(in_RDI + 0xb0) = in_RSI;
  rVar1 = std::ref<asio::io_context>(in_stack_ffffffffffffff78);
  uVar3 = (undefined1)((ulong)rVar1._M_data >> 0x38);
  __r = (shared_ptr<asio::io_context::strand> *)&stack0xffffffffffffffd0;
  std::make_shared<asio::io_context::strand,std::reference_wrapper<asio::io_context>>
            ((reference_wrapper<asio::io_context> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  this_00 = (shared_ptr<asio::io_context::strand> *)(in_RDI + 0xb8);
  std::shared_ptr<asio::io_context::strand>::operator=(this_00,__r);
  std::shared_ptr<asio::io_context::strand>::~shared_ptr
            ((shared_ptr<asio::io_context::strand> *)0x2fe1ac);
  std::shared_ptr<asio::io_context::strand>::shared_ptr(this_00,__r);
  eVar2 = basic_socket::connection::init_asio
                    (in_RSI,(io_service_ptr)in_stack_ffffffffffffffd8._M_pi,
                     (strand_ptr *)in_stack_ffffffffffffffd0,(bool)uVar3);
  std::shared_ptr<asio::io_context::strand>::~shared_ptr
            ((shared_ptr<asio::io_context::strand> *)0x2fe20f);
  eVar2._4_4_ = 0;
  return eVar2;
}

Assistant:

lib::error_code init_asio (io_service_ptr io_service) {
        m_io_service = io_service;

        if (config::enable_multithreading) {
            m_strand = lib::make_shared<lib::asio::io_service::strand>(
                lib::ref(*io_service));
        }

        lib::error_code ec = socket_con_type::init_asio(io_service, m_strand,
            m_is_server);

        return ec;
    }